

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::printStats(Solver *this)

{
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  rusage ru;
  rusage local_a0;
  
  getrusage(RUSAGE_SELF,&local_a0);
  dVar5 = (double)local_a0.ru_utime.tv_usec / 1000000.0 + (double)local_a0.ru_utime.tv_sec;
  dVar4 = memUsedPeak(false);
  printf("restarts              : %lu\n",this->starts);
  uVar1 = this->conflicts;
  auVar6._8_4_ = (int)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._12_4_ = 0x45300000;
  printf("conflicts             : %-12lu   (%.0f /sec)\n",
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar5);
  uVar2 = this->decisions;
  auVar9._8_4_ = (int)(uVar2 >> 0x20);
  auVar9._0_8_ = uVar2;
  auVar9._12_4_ = 0x45300000;
  printf("decisions             : %-12lu   (%4.2f %% random) (%.0f /sec)\n",
         (double)(((float)this->rnd_decisions * 100.0) / (float)uVar2),
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / dVar5);
  uVar1 = this->propagations;
  auVar7._8_4_ = (int)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._12_4_ = 0x45300000;
  printf("propagations          : %-12lu   (%.0f /sec)\n",
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / dVar5);
  uVar1 = this->max_literals;
  lVar3 = (uVar1 - this->tot_literals) * 100;
  auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar10._0_8_ = lVar3;
  auVar10._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  printf("conflict literals     : %-12lu   (%4.2f %% deleted)\n",
         ((auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    printf("Memory used           : %.2f MB\n",dVar4);
  }
  printf("CPU time              : %g s\n",dVar5);
  return;
}

Assistant:

void Solver::printStats() const
{
    double cpu_time = cpuTime();
    double mem_used = memUsedPeak();
    printf("restarts              : %" PRIu64 "\n", starts);
    printf("conflicts             : %-12" PRIu64 "   (%.0f /sec)\n", conflicts   , conflicts   /cpu_time);
    printf("decisions             : %-12" PRIu64 "   (%4.2f %% random) (%.0f /sec)\n", decisions, (float)rnd_decisions*100 / (float)decisions, decisions   /cpu_time);
    printf("propagations          : %-12" PRIu64 "   (%.0f /sec)\n", propagations, propagations/cpu_time);
    printf("conflict literals     : %-12" PRIu64 "   (%4.2f %% deleted)\n", tot_literals, (max_literals - tot_literals)*100 / (double)max_literals);
    if (mem_used != 0) printf("Memory used           : %.2f MB\n", mem_used);
    printf("CPU time              : %g s\n", cpu_time);
}